

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void TPZFMatrix<std::complex<float>_>::MultAdd
               (complex<float> *ptr,int64_t rows,int64_t cols,TPZFMatrix<std::complex<float>_> *x,
               TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
               complex<float> alpha,complex<float> beta,int opt)

{
  bool bVar1;
  bool bVar2;
  TPZFMatrix<std::complex<float>_> *pTVar3;
  TPZFMatrix<std::complex<float>_> *pTVar4;
  int64_t iVar5;
  int64_t iVar6;
  complex<float> *pcVar7;
  TPZFMatrix<std::complex<float>_> *in_RCX;
  TPZFMatrix<std::complex<float>_> *in_RDX;
  TPZFMatrix<std::complex<float>_> *in_RSI;
  long in_RDI;
  TPZFMatrix<std::complex<float>_> *in_R8;
  TPZFMatrix<std::complex<float>_> *in_R9;
  int in_stack_00000008;
  char *in_stack_00000058;
  char *in_stack_00000060;
  complex<float> *xlast;
  complex<float> *xp_1;
  complex<float> val;
  complex<float> *zp_2;
  complex<float> *fp_1;
  complex<float> *xp;
  complex<float> *fp;
  complex<float> *zlast_1;
  complex<float> *zp_1;
  int64_t c_1;
  int64_t i;
  complex<float> *yp;
  complex<float> *zlast;
  complex<float> *zp;
  int64_t c;
  int64_t ic;
  int64_t xcols;
  uint numeq;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffea8;
  complex<float> *in_stack_fffffffffffffeb0;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffeb8;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffec0;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffed8;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffee0;
  complex<float> *local_e8;
  complex<float> local_e0;
  complex<float> *local_d8;
  long local_d0;
  complex<float> *local_b8;
  long local_b0;
  complex<float> *local_a8;
  complex<float> *local_a0;
  long local_98;
  long local_90;
  complex<float> *local_88;
  complex<float> local_80;
  complex<float> *local_78;
  complex<float> *local_70;
  long local_68;
  long local_60;
  long local_58;
  uint local_4c;
  complex<float> local_48;
  TPZFMatrix<std::complex<float>_> *local_40;
  TPZFMatrix<std::complex<float>_> *local_38;
  TPZFMatrix<std::complex<float>_> *local_30;
  TPZFMatrix<std::complex<float>_> *local_28;
  TPZFMatrix<std::complex<float>_> *local_20;
  long local_18;
  
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  if (((in_stack_00000008 == 0) &&
      (pTVar3 = (TPZFMatrix<std::complex<float>_> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX),
      in_RDX != pTVar3)) ||
     ((pTVar3 = local_20, in_stack_00000008 != 0 &&
      (pTVar4 = (TPZFMatrix<std::complex<float>_> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)local_30),
      pTVar3 != pTVar4)))) {
    Error(in_stack_00000060,in_stack_00000058);
    return;
  }
  std::complex<float>::complex(&local_48,0.0,0.0);
  bVar1 = std::operator!=(in_stack_fffffffffffffeb0,(complex<float> *)in_stack_fffffffffffffea8);
  bVar2 = false;
  if (bVar1) {
    if (in_stack_00000008 == 0) {
      in_stack_fffffffffffffee0 = local_20;
      pTVar3 = (TPZFMatrix<std::complex<float>_> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)local_38);
      bVar2 = true;
      if (in_stack_fffffffffffffee0 != pTVar3) goto LAB_01230bf8;
    }
    if (in_stack_00000008 != 0) {
      in_stack_fffffffffffffed8 = local_28;
      pTVar3 = (TPZFMatrix<std::complex<float>_> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)local_38);
      bVar2 = true;
      if (in_stack_fffffffffffffed8 != pTVar3) goto LAB_01230bf8;
    }
    iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_38);
    iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    bVar2 = iVar5 != iVar6;
  }
LAB_01230bf8:
  if (bVar2) {
    Error(in_stack_00000060,in_stack_00000058);
  }
  else {
    if (in_stack_00000008 == 0) {
      iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_40);
      iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
      if ((iVar5 != iVar6) ||
         (pTVar3 = (TPZFMatrix<std::complex<float>_> *)
                   TPZBaseMatrix::Rows((TPZBaseMatrix *)local_40), pTVar3 != local_20)) {
        in_stack_fffffffffffffeb8 = local_40;
        in_stack_fffffffffffffec0 = local_20;
        iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
        (*(in_stack_fffffffffffffeb8->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable[0xe])
                  (in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,iVar5);
      }
    }
    else {
      in_stack_fffffffffffffeb0 = (complex<float> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)local_40);
      pcVar7 = (complex<float> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
      if ((in_stack_fffffffffffffeb0 != pcVar7) ||
         (pTVar3 = (TPZFMatrix<std::complex<float>_> *)
                   TPZBaseMatrix::Rows((TPZBaseMatrix *)local_40), pTVar3 != local_28)) {
        pTVar3 = local_40;
        in_stack_fffffffffffffea8 = local_28;
        iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
        (*(pTVar3->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0xe])(pTVar3,in_stack_fffffffffffffea8,iVar5);
      }
    }
    pTVar3 = local_20;
    if (in_stack_00000008 != 0) {
      pTVar3 = local_28;
    }
    local_4c = (uint)pTVar3;
    local_58 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_30);
    if ((long)local_20 * (long)local_28 != 0) {
      for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
        local_70 = operator()(in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8,
                              (int64_t)in_stack_fffffffffffffeb0);
        local_78 = local_70 + local_4c;
        std::complex<float>::complex(&local_80,0.0,0.0);
        bVar2 = std::operator!=(in_stack_fffffffffffffeb0,
                                (complex<float> *)in_stack_fffffffffffffea8);
        if (bVar2) {
          local_88 = g(local_38,0,local_60);
          if (local_40 != local_38) {
            memcpy(local_70,local_88,(ulong)local_4c << 3);
          }
          for (local_90 = 0; local_90 < (long)(ulong)local_4c; local_90 = local_90 + 1) {
            for (local_98 = 0; local_98 < local_58; local_98 = local_98 + 1) {
              operator()(in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8,
                         (int64_t)in_stack_fffffffffffffeb0);
              std::complex<float>::operator*=
                        ((complex<float> *)in_stack_fffffffffffffee0,
                         (complex<float> *)in_stack_fffffffffffffed8);
            }
          }
        }
        else {
          for (; local_70 != local_78; local_70 = local_70 + 1) {
            std::complex<float>::operator=(local_70,0.0);
          }
        }
      }
      for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
        if (in_stack_00000008 == 0) {
          for (local_68 = 0; local_68 < (long)local_28; local_68 = local_68 + 1) {
            local_a0 = operator()(in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8,
                                  (int64_t)in_stack_fffffffffffffeb0);
            local_a8 = local_a0 + (long)local_20;
            local_b0 = local_18 + (long)local_20 * local_68 * 8;
            local_b8 = g(local_30,local_68,local_60);
            for (; local_a0 < local_a8; local_a0 = local_a0 + 1) {
              local_b0 = local_b0 + 8;
              std::operator*((complex<float> *)pTVar3,(complex<float> *)0x1231070);
              std::operator*((complex<float> *)pTVar3,(complex<float> *)0x123108e);
              std::complex<float>::operator+=
                        (in_stack_fffffffffffffeb0,(complex<float> *)in_stack_fffffffffffffea8);
            }
          }
        }
        else {
          local_d0 = local_18;
          local_d8 = operator()(in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8,
                                (int64_t)in_stack_fffffffffffffeb0);
          for (local_68 = 0; local_68 < (long)local_28; local_68 = local_68 + 1) {
            std::complex<float>::complex(&local_e0,0.0,0.0);
            local_e8 = g(local_30,0,local_60);
            pcVar7 = local_e8 + (long)local_20;
            for (; local_e8 < pcVar7; local_e8 = local_e8 + 1) {
              local_d0 = local_d0 + 8;
              std::operator*((complex<float> *)pTVar3,(complex<float> *)0x12311bb);
              std::complex<float>::operator+=
                        (in_stack_fffffffffffffeb0,(complex<float> *)in_stack_fffffffffffffea8);
            }
            std::operator*((complex<float> *)pTVar3,(complex<float> *)0x12311fe);
            std::complex<float>::operator+=
                      (in_stack_fffffffffffffeb0,(complex<float> *)in_stack_fffffffffffffea8);
            local_d8 = local_d8 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}